

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::
     PrintSmartPointer<libaom_test::CompressedVideoSource,std::unique_ptr<libaom_test::CompressedVideoSource,std::default_delete<libaom_test::CompressedVideoSource>>,void>
               (unique_ptr<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
                *ptr,ostream *os,int param_3)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  if ((ptr->_M_t).
      super___uniq_ptr_impl<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
      ._M_t.
      super__Tuple_impl<0UL,_libaom_test::CompressedVideoSource_*,_std::default_delete<libaom_test::CompressedVideoSource>_>
      .super__Head_base<0UL,_libaom_test::CompressedVideoSource_*,_false>._M_head_impl ==
      (CompressedVideoSource *)0x0) {
    pcVar3 = "(nullptr)";
    lVar2 = 9;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"(ptr = ",7);
    poVar1 = std::ostream::_M_insert<void_const*>(os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,", value = ",10);
    PrintBytesInObjectTo
              ((uchar *)(ptr->_M_t).
                        super___uniq_ptr_impl<libaom_test::CompressedVideoSource,_std::default_delete<libaom_test::CompressedVideoSource>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_libaom_test::CompressedVideoSource_*,_std::default_delete<libaom_test::CompressedVideoSource>_>
                        .super__Head_base<0UL,_libaom_test::CompressedVideoSource_*,_false>.
                        _M_head_impl,8,os);
    pcVar3 = ")";
    lVar2 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  return;
}

Assistant:

void PrintSmartPointer(const Ptr& ptr, std::ostream* os, int) {
  if (ptr == nullptr) {
    *os << "(nullptr)";
  } else {
    *os << "(ptr = " << (VoidifyPointer)(ptr.get()) << ", value = ";
    UniversalPrinter<T>::Print(*ptr, os);
    *os << ")";
  }
}